

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

Vec_Str_t * Scl_LibertyParseGenlibStr(char *pFileName,int fVerbose)

{
  Scl_Tree_t *p;
  Vec_Str_t *pVVar1;
  
  p = Scl_LibertyParse(pFileName,fVerbose);
  if (p == (Scl_Tree_t *)0x0) {
    pVVar1 = (Vec_Str_t *)0x0;
  }
  else {
    pVVar1 = Scl_LibertyReadGenlibStr(p,fVerbose);
    Scl_LibertyStop(p,fVerbose);
  }
  return pVVar1;
}

Assistant:

Vec_Str_t * Scl_LibertyParseGenlibStr( char * pFileName, int fVerbose )
{
    Scl_Tree_t * p;
    Vec_Str_t * vStr;
    p = Scl_LibertyParse( pFileName, fVerbose );
    if ( p == NULL )
        return NULL;
//    Scl_LibertyRead( p, "temp_.lib" );
    vStr = Scl_LibertyReadGenlibStr( p, fVerbose );
    Scl_LibertyStop( p, fVerbose );
//    Scl_LibertyStringDump( "test_genlib.lib", vStr );
    return vStr;
}